

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O2

bool crnlib::file_utils::get_file_size(char *pFilename,uint64 *file_size)

{
  bool bVar1;
  int iVar2;
  stat stat_buf;
  stat sStack_98;
  
  *file_size = 0;
  iVar2 = stat(pFilename,&sStack_98);
  if ((iVar2 == 0) && ((sStack_98.st_mode & 0xf000) == 0x8000)) {
    *file_size = sStack_98.st_size;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool file_utils::get_file_size(const char* pFilename, uint64& file_size)
    {
        file_size = 0;
        struct stat stat_buf;
        int result = stat(pFilename, &stat_buf);
        if (result)
        {
            return false;
        }
        if (!S_ISREG(stat_buf.st_mode))
        {
            return false;
        }
        file_size = stat_buf.st_size;
        return true;
    }